

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_3_4::saveFlatScanLineImage
               (string *fileName,Header *hdr,FlatImage *img,DataWindowSource dws)

{
  bool bVar1;
  int iVar2;
  Attribute *pAVar3;
  string *psVar4;
  string *psVar5;
  FlatImageChannel *pFVar6;
  char *pcVar7;
  long *in_RDX;
  undefined1 auVar8 [16];
  OutputFile out;
  ConstIterator i_1;
  FrameBuffer fb;
  FlatImageLevel *level;
  ConstIterator i;
  Header newHdr;
  FlatImageLevel *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  ImageChannel *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  Header *in_stack_fffffffffffffe58;
  FrameBuffer local_140;
  undefined5 local_f8;
  undefined3 uStack_f3;
  undefined5 local_f0;
  undefined3 uStack_eb;
  undefined5 local_e8;
  undefined3 local_e3;
  undefined5 uStack_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  string local_c8 [48];
  undefined8 local_98;
  undefined8 local_80;
  undefined8 local_68;
  Vec2<float> local_60;
  Header local_58 [64];
  long *local_18;
  
  local_18 = in_RDX;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_4::Header::Header((Header *)0x3f800000,local_58,0x40,0x40,&local_60,0,3);
  local_68 = Imf_3_4::Header::begin();
  while( true ) {
    local_80 = Imf_3_4::Header::end();
    bVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (ConstIterator *)in_stack_fffffffffffffde8);
    if (!bVar1) break;
    pcVar7 = Header::ConstIterator::name((ConstIterator *)0x12daaa);
    iVar2 = strcmp(pcVar7,"dataWindow");
    if (iVar2 != 0) {
      pcVar7 = Header::ConstIterator::name((ConstIterator *)0x12dade);
      iVar2 = strcmp(pcVar7,"tiles");
      if (iVar2 != 0) {
        pcVar7 = Header::ConstIterator::name((ConstIterator *)0x12db12);
        iVar2 = strcmp(pcVar7,"channels");
        if (iVar2 != 0) {
          pAVar3 = (Attribute *)Header::ConstIterator::name((ConstIterator *)0x12db42);
          Header::ConstIterator::attribute((ConstIterator *)0x12db59);
          Imf_3_4::Header::insert((char *)local_58,pAVar3);
        }
      }
    }
    Header::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  dataWindowForFile(in_stack_fffffffffffffe58,
                    (Image *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                    (DataWindowSource)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffde8);
  local_98 = (**(code **)(*local_18 + 0x20))(local_18,0);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x12dc3f);
  local_d0._M_node = (_Base_ptr)FlatImageLevel::begin(in_stack_fffffffffffffde8);
  while( true ) {
    local_d8._M_node = (_Base_ptr)FlatImageLevel::end(in_stack_fffffffffffffde8);
    bVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (ConstIterator *)in_stack_fffffffffffffde8);
    if (!bVar1) break;
    psVar4 = (string *)Imf_3_4::Header::channels();
    psVar5 = FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x12dcca);
    FlatImageLevel::ConstIterator::channel((ConstIterator *)0x12dcde);
    auVar8 = ImageChannel::channel(in_stack_fffffffffffffe00);
    local_f8 = auVar8._0_5_;
    uStack_f3 = auVar8._5_3_;
    local_f0 = auVar8._8_5_;
    uStack_eb = auVar8._13_3_;
    uStack_e0 = local_f0;
    local_e8 = local_f8;
    local_e3 = uStack_f3;
    Imf_3_4::ChannelList::insert(psVar4,(Channel *)psVar5);
    psVar5 = FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x12dd5b);
    pFVar6 = FlatImageLevel::ConstIterator::channel((ConstIterator *)0x12dd6f);
    (*(pFVar6->super_ImageChannel)._vptr_ImageChannel[4])
              (&local_140._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    Imf_3_4::FrameBuffer::insert(local_c8,(Slice *)psVar5);
    FlatImageLevel::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)&local_140,pcVar7,local_58,iVar2);
  Imf_3_4::OutputFile::setFrameBuffer(&local_140);
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::OutputFile::writePixels((int)&local_140);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)&local_140);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x12de9a);
  Imf_3_4::Header::~Header(local_58);
  return;
}

Assistant:

void
saveFlatScanLineImage (
    const string&    fileName,
    const Header&    hdr,
    const FlatImage& img,
    DataWindowSource dws)
{
    Header newHdr;

    for (Header::ConstIterator i = hdr.begin (); i != hdr.end (); ++i)
    {
        if (strcmp (i.name (), "dataWindow") && strcmp (i.name (), "tiles") &&
            strcmp (i.name (), "channels"))
        {
            newHdr.insert (i.name (), i.attribute ());
        }
    }

    newHdr.dataWindow () = dataWindowForFile (hdr, img, dws);

    const FlatImageLevel& level = img.level ();
    FrameBuffer           fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
    {
        newHdr.channels ().insert (i.name (), i.channel ().channel ());
        fb.insert (i.name (), i.channel ().slice ());
    }

    OutputFile out (fileName.c_str (), newHdr);
    out.setFrameBuffer (fb);
    out.writePixels (
        newHdr.dataWindow ().max.y - newHdr.dataWindow ().min.y + 1);
}